

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

void __thiscall MIDISong2::DoRestart(MIDISong2 *this)

{
  byte *pbVar1;
  int iVar2;
  TrackInfo *pTVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  
  iVar2 = this->NumTracks;
  if (0 < (long)iVar2) {
    pTVar3 = this->Tracks;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&pTVar3->TrackP + lVar4) = 0;
      *(undefined2 *)(&pTVar3->Finished + lVar4) = 0;
      (&pTVar3->Designated)[lVar4] = false;
      *(undefined2 *)((long)&pTVar3->Designation + lVar4) = 0;
      *(undefined4 *)((long)&pTVar3->LoopCount + lVar4) = 0xffffffff;
      *(undefined2 *)(&pTVar3->EProgramChange + lVar4) = 0;
      *(undefined4 *)((long)&pTVar3->PlayedTime + lVar4) = 0;
      lVar4 = lVar4 + 0x40;
    } while ((long)iVar2 * 0x40 != lVar4);
  }
  ProcessInitialMetaEvents(this);
  iVar2 = this->NumTracks;
  pTVar3 = this->Tracks;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      uVar5 = 0;
      sVar6 = pTVar3[lVar4].TrackP;
      do {
        if (pTVar3[lVar4].MaxTrackP <= sVar6) break;
        pTVar3[lVar4].TrackP = sVar6 + 1;
        pbVar1 = pTVar3[lVar4].TrackBegin + sVar6;
        uVar5 = uVar5 << 7 | *pbVar1 & 0x7f;
        sVar6 = sVar6 + 1;
      } while ((char)*pbVar1 < '\0');
      pTVar3[lVar4].Delay = uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar2);
  }
  this->TrackDue = pTVar3;
  pTVar3 = FindNextDue(this);
  this->TrackDue = pTVar3;
  return;
}

Assistant:

void MIDISong2 :: DoRestart()
{
	int i;

	// Set initial state.
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].TrackP = 0;
		Tracks[i].Finished = false;
		Tracks[i].RunningStatus = 0;
		Tracks[i].Designated = false;
		Tracks[i].Designation = 0;
		Tracks[i].LoopCount = -1;
		Tracks[i].EProgramChange = false;
		Tracks[i].EVolume = false;
		Tracks[i].PlayedTime = 0;
	}
	ProcessInitialMetaEvents ();
	for (i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Delay = Tracks[i].ReadVarLen();
	}
	TrackDue = Tracks;
	TrackDue = FindNextDue();
}